

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.c
# Opt level: O0

int gb_xor(uint8_t value,Cpu *cpu)

{
  uint8_t *puVar1;
  uint8_t *flags_00;
  uint8_t *flags;
  uint8_t *a;
  Cpu *cpu_local;
  uint8_t value_local;
  
  puVar1 = cpu->registers;
  flags_00 = cpu->registers + 5;
  *puVar1 = *puVar1 ^ value;
  if (*puVar1 == '\0') {
    set_flag(flags_00,Flag_Zero);
  }
  else {
    clear_flag(flags_00,Flag_Zero);
  }
  clear_flag(flags_00,Flag_Sub|Flag_Half_Carry|Flag_Carry);
  return 4;
}

Assistant:

int gb_xor(uint8_t value, Cpu* cpu) {

    uint8_t* a = &(cpu->registers[Register_A]);
    uint8_t* flags = &(cpu->registers[Register_F]);

    *a ^= value;
    *a == 0 ? set_flag(flags, Flag_Zero) : clear_flag(flags, Flag_Zero);

    clear_flag(flags, Flag_Sub | Flag_Half_Carry | Flag_Carry);

    return 4;
}